

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack8to4_int8.h
# Opt level: O0

void ncnn::convolution_pack8to4_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined6 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined4 uVar26;
  undefined6 uVar27;
  size_type __n;
  long *plVar28;
  char *pcVar29;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  char cVar30;
  char cVar38;
  short sVar31;
  short sVar34;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar50;
  short sVar46;
  short sVar49;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  undefined1 auVar35 [16];
  short sVar32;
  short sVar47;
  undefined1 auVar36 [16];
  short sVar33;
  short sVar48;
  undefined1 auVar37 [16];
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _sh3;
  __m128i _sl3;
  __m128i _sh2;
  __m128i _sl2;
  __m128i _sh1;
  __m128i _sl1;
  __m128i _sh0;
  __m128i _sl0;
  __m128i _w3;
  __m128i _w2;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw23;
  __m128i _extw01;
  __m128i _w23;
  __m128i _w01;
  __m128i _val;
  int k;
  char *sptr;
  Mat m;
  int q;
  char *kptr;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  allocator_type *in_stack_fffffffffffff6a0;
  vector<int,_std::allocator<int>_> *this;
  int in_stack_fffffffffffff6b8;
  int in_stack_fffffffffffff6bc;
  undefined1 local_908 [16];
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 uStack_800;
  int local_7f4;
  Mat local_7e8;
  int local_79c;
  Mat local_798;
  long *local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  int local_700;
  int local_6fc;
  Mat local_6f8;
  allocator_type *local_6b0;
  int local_6a8;
  int local_6a4;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  reference local_690;
  undefined1 local_671 [29];
  int local_654;
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  int local_640;
  int local_63c;
  int local_638;
  int local_634;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined4 local_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined4 local_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined4 local_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined4 local_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  long *local_4b8;
  long *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  allocator_type *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  long local_3a8;
  long lStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  long local_388;
  long lStack_380;
  char local_378;
  char cStack_377;
  char cStack_376;
  char cStack_375;
  char cStack_374;
  char cStack_373;
  char cStack_372;
  char cStack_371;
  undefined1 uStack_370;
  undefined1 uStack_36f;
  undefined1 uStack_36e;
  undefined1 uStack_36d;
  undefined1 uStack_36c;
  undefined1 uStack_36b;
  undefined1 uStack_36a;
  undefined1 uStack_369;
  long local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  long local_348;
  long lStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  long local_328;
  long lStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  int iStack_50;
  int iStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  undefined4 local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  long local_18;
  undefined8 uStack_10;
  long *local_8;
  
  local_640 = *(int *)(in_RDI + 0x2c);
  local_644 = *(int *)(in_RDI + 0x38);
  local_648 = *(int *)(in_RSI + 0x2c);
  local_64c = *(int *)(in_RSI + 0x30);
  local_650 = *(int *)(in_RSI + 0x38);
  local_654 = in_ECX * in_R8D;
  __n = (size_type)local_654;
  this = (vector<int,_std::allocator<int>_> *)local_671;
  local_63c = in_R9D;
  local_638 = in_R8D;
  local_634 = in_ECX;
  std::allocator<int>::allocator((allocator<int> *)0x1ce3b4);
  std::vector<int,_std::allocator<int>_>::vector(this,__n,in_stack_fffffffffffff6a0);
  std::allocator<int>::~allocator((allocator<int> *)0x1ce3da);
  local_690 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(local_671 + 1),0);
  local_694 = 0;
  local_698 = 0;
  local_69c = local_640 * in_stack_00000008 - local_634 * local_63c;
  for (local_6a0 = 0; local_6a0 < local_638; local_6a0 = local_6a0 + 1) {
    for (local_6a4 = 0; local_6a4 < local_634; local_6a4 = local_6a4 + 1) {
      local_690[local_694] = local_698;
      local_694 = local_694 + 1;
      local_698 = local_63c + local_698;
    }
    local_698 = local_69c + local_698;
  }
  for (local_6a8 = 0; local_6a8 < local_650; local_6a8 = local_6a8 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                 (int)((ulong)this >> 0x20));
    in_stack_fffffffffffff6a0 = (allocator_type *)Mat::operator_cast_to_int_(&local_6f8);
    Mat::~Mat((Mat *)0x1ce56a);
    local_6b0 = in_stack_fffffffffffff6a0;
    for (local_6fc = 0; local_6fc < local_64c; local_6fc = local_6fc + 1) {
      for (local_700 = 0; local_700 < local_648; local_700 = local_700 + 1) {
        local_428 = 0;
        uStack_420 = 0;
        local_718 = 0;
        uStack_710 = 0;
        local_438 = 0;
        uStack_430 = 0;
        local_728 = 0;
        uStack_720 = 0;
        local_448 = 0;
        uStack_440 = 0;
        local_738 = 0;
        uStack_730 = 0;
        local_458 = 0;
        uStack_450 = 0;
        local_748 = 0;
        uStack_740 = 0;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                     (int)((ulong)this >> 0x20));
        plVar28 = (long *)Mat::operator_cast_to_signed_char_(&local_798);
        Mat::~Mat((Mat *)0x1ce655);
        local_750 = plVar28;
        for (local_79c = 0; local_79c < local_644; local_79c = local_79c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                       (int)((ulong)this >> 0x20));
          pcVar29 = Mat::row<signed_char>(&local_7e8,local_6fc * in_stack_00000018);
          for (local_7f4 = 0; local_7f4 < local_654; local_7f4 = local_7f4 + 1) {
            local_8 = (long *)(pcVar29 +
                              (long)(local_690[local_7f4] << 3) +
                              (long)(local_700 * in_stack_00000010 * 8));
            local_368 = *local_8;
            uStack_10 = 0;
            uStack_360 = 0;
            local_468 = 0;
            uStack_460 = 0;
            local_3c8 = 0;
            uStack_3c0 = 0;
            uStack_3d0 = 0;
            local_3d8._0_1_ = (char)local_368;
            local_3d8._1_1_ = (char)((ulong)local_368 >> 8);
            local_3d8._2_1_ = (char)((ulong)local_368 >> 0x10);
            local_3d8._3_1_ = (char)((ulong)local_368 >> 0x18);
            local_3d8._4_1_ = (char)((ulong)local_368 >> 0x20);
            local_3d8._5_1_ = (char)((ulong)local_368 >> 0x28);
            local_3d8._6_1_ = (char)((ulong)local_368 >> 0x30);
            local_3d8._7_1_ = (undefined1)((ulong)local_368 >> 0x38);
            local_378 = -((char)local_3d8 < '\0');
            cStack_377 = -(local_3d8._1_1_ < '\0');
            cStack_376 = -(local_3d8._2_1_ < '\0');
            cStack_375 = -(local_3d8._3_1_ < '\0');
            cStack_374 = -(local_3d8._4_1_ < '\0');
            cStack_373 = -(local_3d8._5_1_ < '\0');
            cStack_372 = -(local_3d8._6_1_ < '\0');
            cStack_371 = -(local_368 < 0);
            uStack_370 = 0;
            uStack_36f = 0;
            uStack_36e = 0;
            uStack_36d = 0;
            uStack_36c = 0;
            uStack_36b = 0;
            uStack_36a = 0;
            uStack_369 = 0;
            sVar34 = CONCAT11(local_378,(char)local_3d8);
            uVar26 = CONCAT13(cStack_377,CONCAT12(local_3d8._1_1_,sVar34));
            uVar27 = CONCAT15(cStack_376,CONCAT14(local_3d8._2_1_,uVar26));
            local_308 = CONCAT17(cStack_375,CONCAT16(local_3d8._3_1_,uVar27));
            uStack_800._0_2_ = CONCAT11(cStack_374,local_3d8._4_1_);
            uStack_800._0_4_ = CONCAT13(cStack_373,CONCAT12(local_3d8._5_1_,(short)uStack_800));
            uStack_800._0_6_ = CONCAT15(cStack_372,CONCAT14(local_3d8._6_1_,(undefined4)uStack_800))
            ;
            uStack_800 = CONCAT17(cStack_371,CONCAT16(local_3d8._7_1_,(undefined6)uStack_800));
            local_4b0 = local_750;
            local_388 = *local_750;
            lStack_380 = local_750[1];
            local_4b8 = local_750 + 2;
            local_3a8 = *local_4b8;
            lStack_3a0 = local_750[3];
            local_478 = 0;
            uStack_470 = 0;
            local_3e8 = 0;
            uStack_3e0 = 0;
            local_3f8._0_1_ = (char)local_388;
            local_3f8._1_1_ = (char)((ulong)local_388 >> 8);
            local_3f8._2_1_ = (char)((ulong)local_388 >> 0x10);
            local_3f8._3_1_ = (char)((ulong)local_388 >> 0x18);
            local_3f8._4_1_ = (char)((ulong)local_388 >> 0x20);
            local_3f8._5_1_ = (char)((ulong)local_388 >> 0x28);
            local_3f8._6_1_ = (char)((ulong)local_388 >> 0x30);
            local_3f8._7_1_ = (undefined1)((ulong)local_388 >> 0x38);
            uStack_3f0._0_1_ = (char)lStack_380;
            uStack_3f0._1_1_ = (char)((ulong)lStack_380 >> 8);
            uStack_3f0._2_1_ = (char)((ulong)lStack_380 >> 0x10);
            uStack_3f0._3_1_ = (char)((ulong)lStack_380 >> 0x18);
            uStack_3f0._4_1_ = (char)((ulong)lStack_380 >> 0x20);
            uStack_3f0._5_1_ = (char)((ulong)lStack_380 >> 0x28);
            uStack_3f0._6_1_ = (char)((ulong)lStack_380 >> 0x30);
            uStack_3f0._7_1_ = (undefined1)((ulong)lStack_380 >> 0x38);
            cVar57 = -((char)local_3f8 < '\0');
            cVar58 = -(local_3f8._1_1_ < '\0');
            cVar59 = -(local_3f8._2_1_ < '\0');
            cVar60 = -(local_3f8._3_1_ < '\0');
            cVar61 = -(local_3f8._4_1_ < '\0');
            cVar62 = -(local_3f8._5_1_ < '\0');
            cVar63 = -(local_3f8._6_1_ < '\0');
            cVar64 = -(local_388 < 0);
            cVar65 = -((char)uStack_3f0 < '\0');
            cVar66 = -(uStack_3f0._1_1_ < '\0');
            cVar67 = -(uStack_3f0._2_1_ < '\0');
            cVar68 = -(uStack_3f0._3_1_ < '\0');
            cVar69 = -(uStack_3f0._4_1_ < '\0');
            cVar70 = -(uStack_3f0._5_1_ < '\0');
            cVar71 = -(uStack_3f0._6_1_ < '\0');
            cVar72 = -(lStack_380 < 0);
            local_488 = 0;
            uStack_480 = 0;
            local_408 = 0;
            uStack_400 = 0;
            local_418._0_1_ = (char)local_3a8;
            local_418._1_1_ = (char)((ulong)local_3a8 >> 8);
            local_418._2_1_ = (char)((ulong)local_3a8 >> 0x10);
            local_418._3_1_ = (char)((ulong)local_3a8 >> 0x18);
            local_418._4_1_ = (char)((ulong)local_3a8 >> 0x20);
            local_418._5_1_ = (char)((ulong)local_3a8 >> 0x28);
            local_418._6_1_ = (char)((ulong)local_3a8 >> 0x30);
            local_418._7_1_ = (undefined1)((ulong)local_3a8 >> 0x38);
            uStack_410._0_1_ = (char)lStack_3a0;
            uStack_410._1_1_ = (char)((ulong)lStack_3a0 >> 8);
            uStack_410._2_1_ = (char)((ulong)lStack_3a0 >> 0x10);
            uStack_410._3_1_ = (char)((ulong)lStack_3a0 >> 0x18);
            uStack_410._4_1_ = (char)((ulong)lStack_3a0 >> 0x20);
            uStack_410._5_1_ = (char)((ulong)lStack_3a0 >> 0x28);
            uStack_410._6_1_ = (char)((ulong)lStack_3a0 >> 0x30);
            uStack_410._7_1_ = (undefined1)((ulong)lStack_3a0 >> 0x38);
            cVar30 = -((char)local_418 < '\0');
            cVar38 = -(local_418._1_1_ < '\0');
            cVar39 = -(local_418._2_1_ < '\0');
            cVar40 = -(local_418._3_1_ < '\0');
            cVar41 = -(local_418._4_1_ < '\0');
            cVar42 = -(local_418._5_1_ < '\0');
            cVar43 = -(local_418._6_1_ < '\0');
            cVar44 = -(local_3a8 < 0);
            cVar45 = -((char)uStack_410 < '\0');
            cVar50 = -(uStack_410._1_1_ < '\0');
            cVar51 = -(uStack_410._2_1_ < '\0');
            cVar52 = -(uStack_410._3_1_ < '\0');
            cVar53 = -(uStack_410._4_1_ < '\0');
            cVar54 = -(uStack_410._5_1_ < '\0');
            cVar55 = -(uStack_410._6_1_ < '\0');
            cVar56 = -(lStack_3a0 < 0);
            local_398 = CONCAT17(cVar64,CONCAT16(cVar63,CONCAT15(cVar62,CONCAT14(cVar61,CONCAT13(
                                                  cVar60,CONCAT12(cVar59,CONCAT11(cVar58,cVar57)))))
                                                ));
            uStack_390 = CONCAT17(cVar72,CONCAT16(cVar71,CONCAT15(cVar70,CONCAT14(cVar69,CONCAT13(
                                                  cVar68,CONCAT12(cVar67,CONCAT11(cVar66,cVar65)))))
                                                 ));
            local_338 = CONCAT17(cVar64,CONCAT16(cVar63,CONCAT15(cVar62,CONCAT14(cVar61,CONCAT13(
                                                  cVar60,CONCAT12(cVar59,CONCAT11(cVar58,cVar57)))))
                                                ));
            uStack_330 = CONCAT17(cVar72,CONCAT16(cVar71,CONCAT15(cVar70,CONCAT14(cVar69,CONCAT13(
                                                  cVar68,CONCAT12(cVar67,CONCAT11(cVar66,cVar65)))))
                                                 ));
            local_3b8 = CONCAT17(cVar44,CONCAT16(cVar43,CONCAT15(cVar42,CONCAT14(cVar41,CONCAT13(
                                                  cVar40,CONCAT12(cVar39,CONCAT11(cVar38,cVar30)))))
                                                ));
            uStack_3b0 = CONCAT17(cVar56,CONCAT16(cVar55,CONCAT15(cVar54,CONCAT14(cVar53,CONCAT13(
                                                  cVar52,CONCAT12(cVar51,CONCAT11(cVar50,cVar45)))))
                                                 ));
            local_358 = CONCAT17(cVar44,CONCAT16(cVar43,CONCAT15(cVar42,CONCAT14(cVar41,CONCAT13(
                                                  cVar40,CONCAT12(cVar39,CONCAT11(cVar38,cVar30)))))
                                                ));
            uStack_350 = CONCAT17(cVar56,CONCAT16(cVar55,CONCAT15(cVar54,CONCAT14(cVar53,CONCAT13(
                                                  cVar52,CONCAT12(cVar51,CONCAT11(cVar50,cVar45)))))
                                                 ));
            uVar10 = CONCAT13(cVar58,CONCAT12(local_3f8._1_1_,CONCAT11(cVar57,(char)local_3f8)));
            uVar11 = CONCAT15(cVar59,CONCAT14(local_3f8._2_1_,uVar10));
            uVar19 = CONCAT17(cVar60,CONCAT16(local_3f8._3_1_,uVar11));
            uVar13 = CONCAT13(cVar62,CONCAT12(local_3f8._5_1_,CONCAT11(cVar61,local_3f8._4_1_)));
            uVar14 = CONCAT15(cVar63,CONCAT14(local_3f8._6_1_,uVar13));
            uVar20 = CONCAT17(cVar64,CONCAT16(local_3f8._7_1_,uVar14));
            local_2a8._2_2_ = (short)((uint)uVar26 >> 0x10);
            local_2a8._4_2_ = (short)((uint6)uVar27 >> 0x20);
            local_2a8._6_2_ = (short)((ulong)local_308 >> 0x30);
            uStack_2a0._2_2_ = (short)((uint)(undefined4)uStack_800 >> 0x10);
            uStack_2a0._4_2_ = (short)((uint6)(undefined6)uStack_800 >> 0x20);
            uStack_2a0._6_2_ = (short)((ulong)uStack_800 >> 0x30);
            local_2b8._2_2_ = (short)((uint)uVar10 >> 0x10);
            local_2b8._4_2_ = (short)((uint6)uVar11 >> 0x20);
            local_2b8._6_2_ = (short)((ulong)uVar19 >> 0x30);
            uStack_2b0._2_2_ = (short)((uint)uVar13 >> 0x10);
            uStack_2b0._4_2_ = (short)((uint6)uVar14 >> 0x20);
            uStack_2b0._6_2_ = (short)((ulong)uVar20 >> 0x30);
            sVar31 = sVar34 * CONCAT11(cVar57,(char)local_3f8);
            local_2b8._2_2_ = local_2a8._2_2_ * local_2b8._2_2_;
            local_2b8._4_2_ = local_2a8._4_2_ * local_2b8._4_2_;
            local_2b8._6_2_ = local_2a8._6_2_ * local_2b8._6_2_;
            sVar46 = (short)uStack_800 * CONCAT11(cVar61,local_3f8._4_1_);
            uStack_2b0._2_2_ = uStack_2a0._2_2_ * uStack_2b0._2_2_;
            uStack_2b0._4_2_ = uStack_2a0._4_2_ * uStack_2b0._4_2_;
            uStack_2b0._6_2_ = uStack_2a0._6_2_ * uStack_2b0._6_2_;
            uStack_220 = uStack_800;
            local_238 = CONCAT17(cVar60,CONCAT16(local_3f8._3_1_,
                                                 CONCAT15(cVar59,CONCAT14(local_3f8._2_1_,
                                                                          CONCAT13(cVar58,CONCAT12(
                                                  local_3f8._1_1_,CONCAT11(cVar57,(char)local_3f8)))
                                                  ))));
            uStack_230 = CONCAT17(cVar64,CONCAT16(local_3f8._7_1_,
                                                  CONCAT15(cVar63,CONCAT14(local_3f8._6_1_,
                                                                           CONCAT13(cVar62,CONCAT12(
                                                  local_3f8._5_1_,CONCAT11(cVar61,local_3f8._4_1_)))
                                                  ))));
            auVar25._8_8_ = uStack_800;
            auVar25._0_8_ = local_308;
            auVar35._8_8_ = uStack_230;
            auVar35._0_8_ = local_238;
            auVar35 = pmulhw(auVar25,auVar35);
            uStack_2c0 = uStack_800;
            uVar10 = CONCAT13(cVar66,CONCAT12(uStack_3f0._1_1_,CONCAT11(cVar65,(char)uStack_3f0)));
            uVar11 = CONCAT15(cVar67,CONCAT14(uStack_3f0._2_1_,uVar10));
            uVar17 = CONCAT17(cVar68,CONCAT16(uStack_3f0._3_1_,uVar11));
            uVar13 = CONCAT13(cVar70,CONCAT12(uStack_3f0._5_1_,CONCAT11(cVar69,uStack_3f0._4_1_)));
            uVar14 = CONCAT15(cVar71,CONCAT14(uStack_3f0._6_1_,uVar13));
            uVar18 = CONCAT17(cVar72,CONCAT16(uStack_3f0._7_1_,uVar14));
            local_2d8._2_2_ = (short)((uint)uVar10 >> 0x10);
            local_2d8._4_2_ = (short)((uint6)uVar11 >> 0x20);
            local_2d8._6_2_ = (short)((ulong)uVar17 >> 0x30);
            uStack_2d0._2_2_ = (short)((uint)uVar13 >> 0x10);
            uStack_2d0._4_2_ = (short)((uint6)uVar14 >> 0x20);
            uStack_2d0._6_2_ = (short)((ulong)uVar18 >> 0x30);
            sVar32 = sVar34 * CONCAT11(cVar65,(char)uStack_3f0);
            local_2d8._2_2_ = local_2a8._2_2_ * local_2d8._2_2_;
            local_2d8._4_2_ = local_2a8._4_2_ * local_2d8._4_2_;
            local_2d8._6_2_ = local_2a8._6_2_ * local_2d8._6_2_;
            sVar47 = (short)uStack_800 * CONCAT11(cVar69,uStack_3f0._4_1_);
            uStack_2d0._2_2_ = uStack_2a0._2_2_ * uStack_2d0._2_2_;
            uStack_2d0._4_2_ = uStack_2a0._4_2_ * uStack_2d0._4_2_;
            uStack_2d0._6_2_ = uStack_2a0._6_2_ * uStack_2d0._6_2_;
            uStack_240 = uStack_800;
            local_258 = CONCAT17(cVar68,CONCAT16(uStack_3f0._3_1_,
                                                 CONCAT15(cVar67,CONCAT14(uStack_3f0._2_1_,
                                                                          CONCAT13(cVar66,CONCAT12(
                                                  uStack_3f0._1_1_,CONCAT11(cVar65,(char)uStack_3f0)
                                                  ))))));
            uStack_250 = CONCAT17(cVar72,CONCAT16(uStack_3f0._7_1_,
                                                  CONCAT15(cVar71,CONCAT14(uStack_3f0._6_1_,
                                                                           CONCAT13(cVar70,CONCAT12(
                                                  uStack_3f0._5_1_,CONCAT11(cVar69,uStack_3f0._4_1_)
                                                  ))))));
            auVar24._8_8_ = uStack_800;
            auVar24._0_8_ = local_308;
            auVar36._8_8_ = uStack_250;
            auVar36._0_8_ = local_258;
            auVar36 = pmulhw(auVar24,auVar36);
            uStack_2e0 = uStack_800;
            uVar10 = CONCAT13(cVar38,CONCAT12(local_418._1_1_,CONCAT11(cVar30,(char)local_418)));
            uVar11 = CONCAT15(cVar39,CONCAT14(local_418._2_1_,uVar10));
            uVar15 = CONCAT17(cVar40,CONCAT16(local_418._3_1_,uVar11));
            uVar13 = CONCAT13(cVar42,CONCAT12(local_418._5_1_,CONCAT11(cVar41,local_418._4_1_)));
            uVar14 = CONCAT15(cVar43,CONCAT14(local_418._6_1_,uVar13));
            uVar16 = CONCAT17(cVar44,CONCAT16(local_418._7_1_,uVar14));
            local_2f8._2_2_ = (short)((uint)uVar10 >> 0x10);
            local_2f8._4_2_ = (short)((uint6)uVar11 >> 0x20);
            local_2f8._6_2_ = (short)((ulong)uVar15 >> 0x30);
            uStack_2f0._2_2_ = (short)((uint)uVar13 >> 0x10);
            uStack_2f0._4_2_ = (short)((uint6)uVar14 >> 0x20);
            uStack_2f0._6_2_ = (short)((ulong)uVar16 >> 0x30);
            sVar33 = sVar34 * CONCAT11(cVar30,(char)local_418);
            local_2f8._2_2_ = local_2a8._2_2_ * local_2f8._2_2_;
            local_2f8._4_2_ = local_2a8._4_2_ * local_2f8._4_2_;
            local_2f8._6_2_ = local_2a8._6_2_ * local_2f8._6_2_;
            sVar48 = (short)uStack_800 * CONCAT11(cVar41,local_418._4_1_);
            uStack_2f0._2_2_ = uStack_2a0._2_2_ * uStack_2f0._2_2_;
            uStack_2f0._4_2_ = uStack_2a0._4_2_ * uStack_2f0._4_2_;
            uStack_2f0._6_2_ = uStack_2a0._6_2_ * uStack_2f0._6_2_;
            uStack_260 = uStack_800;
            local_278 = CONCAT17(cVar40,CONCAT16(local_418._3_1_,
                                                 CONCAT15(cVar39,CONCAT14(local_418._2_1_,
                                                                          CONCAT13(cVar38,CONCAT12(
                                                  local_418._1_1_,CONCAT11(cVar30,(char)local_418)))
                                                  ))));
            uStack_270 = CONCAT17(cVar44,CONCAT16(local_418._7_1_,
                                                  CONCAT15(cVar43,CONCAT14(local_418._6_1_,
                                                                           CONCAT13(cVar42,CONCAT12(
                                                  local_418._5_1_,CONCAT11(cVar41,local_418._4_1_)))
                                                  ))));
            auVar23._8_8_ = uStack_800;
            auVar23._0_8_ = local_308;
            auVar37._8_8_ = uStack_270;
            auVar37._0_8_ = local_278;
            auVar37 = pmulhw(auVar23,auVar37);
            uStack_300 = uStack_800;
            uVar10 = CONCAT13(cVar50,CONCAT12(uStack_410._1_1_,CONCAT11(cVar45,(char)uStack_410)));
            uVar11 = CONCAT15(cVar51,CONCAT14(uStack_410._2_1_,uVar10));
            uVar9 = CONCAT17(cVar52,CONCAT16(uStack_410._3_1_,uVar11));
            uVar13 = CONCAT13(cVar54,CONCAT12(uStack_410._5_1_,CONCAT11(cVar53,uStack_410._4_1_)));
            uVar14 = CONCAT15(cVar55,CONCAT14(uStack_410._6_1_,uVar13));
            uVar12 = CONCAT17(cVar56,CONCAT16(uStack_410._7_1_,uVar14));
            local_318._2_2_ = (short)((uint)uVar10 >> 0x10);
            local_318._4_2_ = (short)((uint6)uVar11 >> 0x20);
            local_318._6_2_ = (short)((ulong)uVar9 >> 0x30);
            uStack_310._2_2_ = (short)((uint)uVar13 >> 0x10);
            uStack_310._4_2_ = (short)((uint6)uVar14 >> 0x20);
            uStack_310._6_2_ = (short)((ulong)uVar12 >> 0x30);
            sVar34 = sVar34 * CONCAT11(cVar45,(char)uStack_410);
            local_2a8._2_2_ = local_2a8._2_2_ * local_318._2_2_;
            local_2a8._4_2_ = local_2a8._4_2_ * local_318._4_2_;
            local_2a8._6_2_ = local_2a8._6_2_ * local_318._6_2_;
            sVar49 = (short)uStack_800 * CONCAT11(cVar53,uStack_410._4_1_);
            uStack_2a0._2_2_ = uStack_2a0._2_2_ * uStack_310._2_2_;
            uStack_2a0._4_2_ = uStack_2a0._4_2_ * uStack_310._4_2_;
            uStack_2a0._6_2_ = uStack_2a0._6_2_ * uStack_310._6_2_;
            uStack_280 = uStack_800;
            local_298 = CONCAT17(cVar52,CONCAT16(uStack_410._3_1_,
                                                 CONCAT15(cVar51,CONCAT14(uStack_410._2_1_,
                                                                          CONCAT13(cVar50,CONCAT12(
                                                  uStack_410._1_1_,CONCAT11(cVar45,(char)uStack_410)
                                                  ))))));
            uStack_290 = CONCAT17(cVar56,CONCAT16(uStack_410._7_1_,
                                                  CONCAT15(cVar55,CONCAT14(uStack_410._6_1_,
                                                                           CONCAT13(cVar54,CONCAT12(
                                                  uStack_410._5_1_,CONCAT11(cVar53,uStack_410._4_1_)
                                                  ))))));
            auVar22._8_8_ = uStack_800;
            auVar22._0_8_ = local_308;
            auVar21._8_8_ = uStack_290;
            auVar21._0_8_ = local_298;
            local_908 = pmulhw(auVar22,auVar21);
            uVar1 = local_718;
            uVar2 = uStack_710;
            local_1a8 = CONCAT26(local_2b8._6_2_,
                                 CONCAT24(local_2b8._4_2_,CONCAT22(local_2b8._2_2_,sVar31)));
            uStack_1a0 = CONCAT26(uStack_2b0._6_2_,
                                  CONCAT24(uStack_2b0._4_2_,CONCAT22(uStack_2b0._2_2_,sVar46)));
            local_8a8 = auVar35._0_8_;
            uStack_8a0 = auVar35._8_8_;
            uStack_1b0 = uStack_8a0;
            local_1b8._0_2_ = auVar35._0_2_;
            local_1b8._2_2_ = auVar35._2_2_;
            local_1b8._4_2_ = auVar35._4_2_;
            local_1b8._6_2_ = auVar35._6_2_;
            local_4d8 = CONCAT22((undefined2)local_1b8,sVar31);
            uStack_4d4 = CONCAT22(local_1b8._2_2_,local_2b8._2_2_);
            uStack_4d0 = CONCAT22(local_1b8._4_2_,local_2b8._4_2_);
            uStack_4cc = CONCAT22(local_1b8._6_2_,local_2b8._6_2_);
            local_4c8._0_4_ = (int)local_718;
            local_4c8._4_4_ = (int)((ulong)local_718 >> 0x20);
            uStack_4c0._0_4_ = (int)uStack_710;
            uStack_4c0._4_4_ = (int)((ulong)uStack_710 >> 0x20);
            local_718 = CONCAT44(local_4c8._4_4_ + uStack_4d4,(int)local_4c8 + local_4d8);
            uStack_710 = CONCAT44(uStack_4c0._4_4_ + uStack_4cc,(int)uStack_4c0 + uStack_4d0);
            uVar3 = local_728;
            uVar4 = uStack_720;
            local_1c8 = CONCAT26(local_2d8._6_2_,
                                 CONCAT24(local_2d8._4_2_,CONCAT22(local_2d8._2_2_,sVar32)));
            uStack_1c0 = CONCAT26(uStack_2d0._6_2_,
                                  CONCAT24(uStack_2d0._4_2_,CONCAT22(uStack_2d0._2_2_,sVar47)));
            local_8c8 = auVar36._0_8_;
            uStack_8c0 = auVar36._8_8_;
            uStack_1d0 = uStack_8c0;
            local_1d8._0_2_ = auVar36._0_2_;
            local_1d8._2_2_ = auVar36._2_2_;
            local_1d8._4_2_ = auVar36._4_2_;
            local_1d8._6_2_ = auVar36._6_2_;
            local_4f8 = CONCAT22((undefined2)local_1d8,sVar32);
            uStack_4f4 = CONCAT22(local_1d8._2_2_,local_2d8._2_2_);
            uStack_4f0 = CONCAT22(local_1d8._4_2_,local_2d8._4_2_);
            uStack_4ec = CONCAT22(local_1d8._6_2_,local_2d8._6_2_);
            local_4e8._0_4_ = (int)local_728;
            local_4e8._4_4_ = (int)((ulong)local_728 >> 0x20);
            uStack_4e0._0_4_ = (int)uStack_720;
            uStack_4e0._4_4_ = (int)((ulong)uStack_720 >> 0x20);
            local_728 = CONCAT44(local_4e8._4_4_ + uStack_4f4,(int)local_4e8 + local_4f8);
            uStack_720 = CONCAT44(uStack_4e0._4_4_ + uStack_4ec,(int)uStack_4e0 + uStack_4f0);
            uVar5 = local_738;
            uVar6 = uStack_730;
            local_1e8 = CONCAT26(local_2f8._6_2_,
                                 CONCAT24(local_2f8._4_2_,CONCAT22(local_2f8._2_2_,sVar33)));
            uStack_1e0 = CONCAT26(uStack_2f0._6_2_,
                                  CONCAT24(uStack_2f0._4_2_,CONCAT22(uStack_2f0._2_2_,sVar48)));
            local_8e8 = auVar37._0_8_;
            uStack_8e0 = auVar37._8_8_;
            uStack_1f0 = uStack_8e0;
            local_1f8._0_2_ = auVar37._0_2_;
            local_1f8._2_2_ = auVar37._2_2_;
            local_1f8._4_2_ = auVar37._4_2_;
            local_1f8._6_2_ = auVar37._6_2_;
            local_518 = CONCAT22((undefined2)local_1f8,sVar33);
            uStack_514 = CONCAT22(local_1f8._2_2_,local_2f8._2_2_);
            uStack_510 = CONCAT22(local_1f8._4_2_,local_2f8._4_2_);
            uStack_50c = CONCAT22(local_1f8._6_2_,local_2f8._6_2_);
            local_508._0_4_ = (int)local_738;
            local_508._4_4_ = (int)((ulong)local_738 >> 0x20);
            uStack_500._0_4_ = (int)uStack_730;
            uStack_500._4_4_ = (int)((ulong)uStack_730 >> 0x20);
            local_738 = CONCAT44(local_508._4_4_ + uStack_514,(int)local_508 + local_518);
            uStack_730 = CONCAT44(uStack_500._4_4_ + uStack_50c,(int)uStack_500 + uStack_510);
            uVar7 = local_748;
            uVar8 = uStack_740;
            local_208 = CONCAT26(local_2a8._6_2_,
                                 CONCAT24(local_2a8._4_2_,CONCAT22(local_2a8._2_2_,sVar34)));
            uStack_200 = CONCAT26(uStack_2a0._6_2_,
                                  CONCAT24(uStack_2a0._4_2_,CONCAT22(uStack_2a0._2_2_,sVar49)));
            uStack_210 = local_908._8_8_;
            local_218._0_2_ = local_908._0_2_;
            local_218._2_2_ = local_908._2_2_;
            local_218._4_2_ = local_908._4_2_;
            local_218._6_2_ = local_908._6_2_;
            local_538 = CONCAT22((undefined2)local_218,sVar34);
            uStack_534 = CONCAT22(local_218._2_2_,local_2a8._2_2_);
            uStack_530 = CONCAT22(local_218._4_2_,local_2a8._4_2_);
            uStack_52c = CONCAT22(local_218._6_2_,local_2a8._6_2_);
            local_528._0_4_ = (int)local_748;
            local_528._4_4_ = (int)((ulong)local_748 >> 0x20);
            uStack_520._0_4_ = (int)uStack_740;
            uStack_520._4_4_ = (int)((ulong)uStack_740 >> 0x20);
            local_748 = CONCAT44(local_528._4_4_ + uStack_534,(int)local_528 + local_538);
            uStack_740 = CONCAT44(uStack_520._4_4_ + uStack_52c,(int)uStack_520 + uStack_530);
            local_548 = local_718;
            uStack_540 = uStack_710;
            local_128 = CONCAT26(local_2b8._6_2_,
                                 CONCAT24(local_2b8._4_2_,CONCAT22(local_2b8._2_2_,sVar31)));
            uStack_120 = CONCAT26(uStack_2b0._6_2_,
                                  CONCAT24(uStack_2b0._4_2_,CONCAT22(uStack_2b0._2_2_,sVar46)));
            local_138 = local_8a8;
            uStack_130._0_2_ = auVar35._8_2_;
            uStack_130._2_2_ = auVar35._10_2_;
            uStack_130._4_2_ = auVar35._12_2_;
            uStack_130._6_2_ = auVar35._14_2_;
            local_558 = CONCAT22((undefined2)uStack_130,sVar46);
            uStack_554 = CONCAT22(uStack_130._2_2_,uStack_2b0._2_2_);
            uStack_550 = CONCAT22(uStack_130._4_2_,uStack_2b0._4_2_);
            uStack_54c = CONCAT22(uStack_130._6_2_,uStack_2b0._6_2_);
            local_718 = CONCAT44(local_4c8._4_4_ + uStack_4d4 + uStack_554,
                                 (int)local_4c8 + local_4d8 + local_558);
            uStack_710 = CONCAT44(uStack_4c0._4_4_ + uStack_4cc + uStack_54c,
                                  (int)uStack_4c0 + uStack_4d0 + uStack_550);
            local_568 = local_728;
            uStack_560 = uStack_720;
            local_148 = CONCAT26(local_2d8._6_2_,
                                 CONCAT24(local_2d8._4_2_,CONCAT22(local_2d8._2_2_,sVar32)));
            uStack_140 = CONCAT26(uStack_2d0._6_2_,
                                  CONCAT24(uStack_2d0._4_2_,CONCAT22(uStack_2d0._2_2_,sVar47)));
            local_158 = local_8c8;
            uStack_150._0_2_ = auVar36._8_2_;
            uStack_150._2_2_ = auVar36._10_2_;
            uStack_150._4_2_ = auVar36._12_2_;
            uStack_150._6_2_ = auVar36._14_2_;
            local_578 = CONCAT22((undefined2)uStack_150,sVar47);
            uStack_574 = CONCAT22(uStack_150._2_2_,uStack_2d0._2_2_);
            uStack_570 = CONCAT22(uStack_150._4_2_,uStack_2d0._4_2_);
            uStack_56c = CONCAT22(uStack_150._6_2_,uStack_2d0._6_2_);
            local_728 = CONCAT44(local_4e8._4_4_ + uStack_4f4 + uStack_574,
                                 (int)local_4e8 + local_4f8 + local_578);
            uStack_720 = CONCAT44(uStack_4e0._4_4_ + uStack_4ec + uStack_56c,
                                  (int)uStack_4e0 + uStack_4f0 + uStack_570);
            local_588 = local_738;
            uStack_580 = uStack_730;
            local_168 = CONCAT26(local_2f8._6_2_,
                                 CONCAT24(local_2f8._4_2_,CONCAT22(local_2f8._2_2_,sVar33)));
            uStack_160 = CONCAT26(uStack_2f0._6_2_,
                                  CONCAT24(uStack_2f0._4_2_,CONCAT22(uStack_2f0._2_2_,sVar48)));
            local_178 = local_8e8;
            uStack_170._0_2_ = auVar37._8_2_;
            uStack_170._2_2_ = auVar37._10_2_;
            uStack_170._4_2_ = auVar37._12_2_;
            uStack_170._6_2_ = auVar37._14_2_;
            local_598 = CONCAT22((undefined2)uStack_170,sVar48);
            uStack_594 = CONCAT22(uStack_170._2_2_,uStack_2f0._2_2_);
            uStack_590 = CONCAT22(uStack_170._4_2_,uStack_2f0._4_2_);
            uStack_58c = CONCAT22(uStack_170._6_2_,uStack_2f0._6_2_);
            local_738 = CONCAT44(local_508._4_4_ + uStack_514 + uStack_594,
                                 (int)local_508 + local_518 + local_598);
            uStack_730 = CONCAT44(uStack_500._4_4_ + uStack_50c + uStack_58c,
                                  (int)uStack_500 + uStack_510 + uStack_590);
            local_5a8 = local_748;
            uStack_5a0 = uStack_740;
            local_188 = CONCAT26(local_2a8._6_2_,
                                 CONCAT24(local_2a8._4_2_,CONCAT22(local_2a8._2_2_,sVar34)));
            uStack_180 = CONCAT26(uStack_2a0._6_2_,
                                  CONCAT24(uStack_2a0._4_2_,CONCAT22(uStack_2a0._2_2_,sVar49)));
            local_198 = local_908._0_8_;
            uStack_190._0_2_ = local_908._8_2_;
            uStack_190._2_2_ = local_908._10_2_;
            uStack_190._4_2_ = local_908._12_2_;
            uStack_190._6_2_ = local_908._14_2_;
            local_5b8 = CONCAT22((undefined2)uStack_190,sVar49);
            uStack_5b4 = CONCAT22(uStack_190._2_2_,uStack_2a0._2_2_);
            uStack_5b0 = CONCAT22(uStack_190._4_2_,uStack_2a0._4_2_);
            uStack_5ac = CONCAT22(uStack_190._6_2_,uStack_2a0._6_2_);
            local_748 = CONCAT44(local_528._4_4_ + uStack_534 + uStack_5b4,
                                 (int)local_528 + local_538 + local_5b8);
            uStack_740 = CONCAT44(uStack_520._4_4_ + uStack_52c + uStack_5ac,
                                  (int)uStack_520 + uStack_530 + uStack_5b0);
            local_750 = local_750 + 4;
            local_528 = uVar7;
            uStack_520 = uVar8;
            local_508 = uVar5;
            uStack_500 = uVar6;
            local_4e8 = uVar3;
            uStack_4e0 = uVar4;
            local_4c8 = uVar1;
            uStack_4c0 = uVar2;
            local_418 = local_3a8;
            uStack_410 = lStack_3a0;
            local_3f8 = local_388;
            uStack_3f0 = lStack_380;
            local_3d8 = local_368;
            local_348 = local_3a8;
            lStack_340 = lStack_3a0;
            local_328 = local_388;
            lStack_320 = lStack_380;
            local_318 = uVar9;
            uStack_310 = uVar12;
            local_2f8 = uVar15;
            uStack_2f0 = uVar16;
            local_2e8 = local_308;
            local_2d8 = uVar17;
            uStack_2d0 = uVar18;
            local_2c8 = local_308;
            local_2b8 = uVar19;
            uStack_2b0 = uVar20;
            local_2a8 = local_308;
            uStack_2a0 = uStack_800;
            local_288 = local_308;
            local_268 = local_308;
            local_248 = local_308;
            local_228 = local_308;
            local_218 = local_908._0_8_;
            local_1f8 = local_8e8;
            local_1d8 = local_8c8;
            local_1b8 = local_8a8;
            uStack_190 = local_908._8_8_;
            uStack_170 = uStack_8e0;
            uStack_150 = uStack_8c0;
            uStack_130 = uStack_8a0;
            local_18 = local_368;
          }
          Mat::~Mat((Mat *)0x1cef1f);
        }
        uVar1 = local_718;
        uStack_e0 = uStack_710;
        uStack_f0 = uStack_720;
        local_e8._0_4_ = (undefined4)local_718;
        local_e8._4_4_ = (undefined4)((ulong)local_718 >> 0x20);
        local_f8._0_4_ = (int)local_728;
        local_f8._4_4_ = (int)((ulong)local_728 >> 0x20);
        uVar2 = local_738;
        uStack_100 = uStack_730;
        uStack_110 = uStack_740;
        local_108._0_4_ = (int)local_738;
        local_108._4_4_ = (undefined4)((ulong)local_738 >> 0x20);
        local_118._0_4_ = (int)local_748;
        local_118._4_4_ = (int)((ulong)local_748 >> 0x20);
        local_a8 = local_718;
        uVar3 = uStack_710;
        local_b8 = local_728;
        uVar4 = uStack_720;
        uStack_a0._0_4_ = (undefined4)uStack_710;
        uStack_a0._4_4_ = (undefined4)((ulong)uStack_710 >> 0x20);
        uStack_b0._0_4_ = (undefined4)uStack_720;
        uStack_b0._4_4_ = (int)((ulong)uStack_720 >> 0x20);
        local_c8 = local_738;
        uVar5 = uStack_730;
        local_d8 = local_748;
        uVar6 = uStack_740;
        uStack_c0._0_4_ = (int)uStack_730;
        uStack_c0._4_4_ = (undefined4)((ulong)uStack_730 >> 0x20);
        uStack_d0._0_4_ = (int)uStack_740;
        uStack_d0._4_4_ = (int)((ulong)uStack_740 >> 0x20);
        local_68 = CONCAT44((int)local_f8,(undefined4)local_e8);
        uStack_60 = CONCAT44(local_f8._4_4_,local_e8._4_4_);
        uStack_5c0 = CONCAT44((int)local_118,(int)local_108);
        uStack_70 = CONCAT44(local_118._4_4_,local_108._4_4_);
        iStack_1c = local_f8._4_4_;
        iStack_2c = local_118._4_4_;
        local_18 = CONCAT44(local_18._4_4_,local_908._0_4_);
        _local_28 = CONCAT44((int)local_f8,(undefined4)local_e8);
        uStack_720 = CONCAT44(local_f8._4_4_,iStack_20);
        local_718 = CONCAT44(local_118._4_4_,iStack_30);
        local_88 = CONCAT44((undefined4)uStack_b0,(undefined4)uStack_a0);
        uStack_80 = CONCAT44(uStack_b0._4_4_,uStack_a0._4_4_);
        uStack_5e0 = CONCAT44((int)uStack_d0,(int)uStack_c0);
        uStack_90 = CONCAT44(uStack_d0._4_4_,uStack_c0._4_4_);
        iStack_3c = uStack_b0._4_4_;
        local_58 = CONCAT44((int)uStack_d0,(int)uStack_c0);
        iStack_4c = uStack_d0._4_4_;
        _local_38 = CONCAT44((int)local_118,(int)local_108);
        _local_48 = CONCAT44((undefined4)uStack_b0,(undefined4)uStack_a0);
        uStack_740 = CONCAT44(uStack_b0._4_4_,iStack_40);
        local_738 = CONCAT44(uStack_d0._4_4_,iStack_50);
        local_5c8 = local_718;
        local_5d8 = local_728;
        uStack_5d0 = uStack_720;
        local_718 = CONCAT44(local_118._4_4_ + local_f8._4_4_,iStack_30 + (int)local_f8);
        uStack_710 = CONCAT44((int)local_118 + local_f8._4_4_,(int)local_108 + iStack_20);
        local_5e8 = local_738;
        local_5f8 = local_748;
        uStack_5f0 = uStack_740;
        local_738 = CONCAT44(uStack_d0._4_4_ + local_118._4_4_,iStack_50 + (int)local_118);
        uStack_730 = CONCAT44((int)uStack_d0 + uStack_b0._4_4_,(int)uStack_c0 + iStack_40);
        local_608 = local_718;
        uStack_600 = uStack_710;
        local_618 = local_738;
        uStack_610 = uStack_730;
        local_718 = CONCAT44(local_118._4_4_ + local_f8._4_4_ + uStack_d0._4_4_ + local_118._4_4_,
                             iStack_30 + (int)local_f8 + iStack_50 + (int)local_118);
        uStack_710 = CONCAT44((int)local_118 + local_f8._4_4_ + (int)uStack_d0 + uStack_b0._4_4_,
                              (int)local_108 + iStack_20 + (int)uStack_c0 + iStack_40);
        local_490 = local_6b0 + (long)(local_700 << 2) * 4;
        local_4a8 = local_718;
        uStack_4a0 = uStack_710;
        *(undefined8 *)local_490 = local_718;
        *(undefined8 *)(local_490 + 8) = uStack_710;
        in_stack_fffffffffffff6b8 = (int)uStack_c0;
        in_stack_fffffffffffff6bc = (int)uStack_d0;
        local_118 = local_748;
        local_108 = uVar2;
        local_f8 = local_728;
        local_e8 = uVar1;
        uStack_d0 = uVar6;
        uStack_c0 = uVar5;
        uStack_b0 = uVar4;
        uStack_a0 = uVar3;
        local_98 = uStack_5e0;
        local_78 = uStack_5c0;
      }
      local_6b0 = local_6b0 + (long)(local_648 << 2) * 4;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6a0);
  return;
}

Assistant:

static void convolution_pack8to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128i _sum0 = _mm_setzero_si128();
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                const signed char* kptr = weight_data_int8.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w * 8;

                    for (int k = 0; k < maxk; k++)
                    {
                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                        _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr);
                        __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr + 16));
                        __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                        __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                        __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                        __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                        __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                        __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                        __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                        __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                        __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                        __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                        __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                        __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                        __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                        __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                        _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                        _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                        _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                        _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                        _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                        _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                        _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                        _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));

                        kptr += 32;
                    }
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);

                _sum0 = _mm_add_epi32(_sum0, _sum2);

                _mm_storeu_si128((__m128i*)(outptr + j * 4), _sum0);
            }

            outptr += outw * 4;
        }
    }
}